

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O2

void __thiscall spvtools::opt::IRContext::BuildCFG(IRContext *this)

{
  pointer __p;
  _Head_base<0UL,_spvtools::opt::Module_*,_false> local_20;
  pointer local_18;
  
  local_20._M_head_impl =
       (this->module_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>.
       _M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>.
       super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  MakeUnique<spvtools::opt::CFG,spvtools::opt::Module*>
            ((spvtools *)&local_18,&local_20._M_head_impl);
  __p = local_18;
  local_18 = (pointer)0x0;
  std::__uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>::reset
            ((__uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_> *)
             &this->cfg_,__p);
  std::unique_ptr<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>::~unique_ptr
            ((unique_ptr<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_> *)&local_18);
  *(undefined1 *)&this->valid_analyses_ = (char)this->valid_analyses_ | kAnalysisCFG;
  return;
}

Assistant:

void BuildCFG() {
    cfg_ = MakeUnique<CFG>(module());
    valid_analyses_ = valid_analyses_ | kAnalysisCFG;
  }